

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_reference(lys_module *module,void *node,char *value,char *where,yytokentype type)

{
  char *ref;
  int ret;
  yytokentype type_local;
  char *where_local;
  char *value_local;
  void *node_local;
  lys_module *module_local;
  
  if (type == IMPORT_KEYWORD) {
    ref._0_4_ = yang_check_string(module,(char **)((long)node + 0x30),"reference",where,value,
                                  (lys_node *)0x0);
  }
  else if (type == INCLUDE_KEYWORD) {
    ref._0_4_ = yang_check_string(module,(char **)((long)node + 0x28),"reference",where,value,
                                  (lys_node *)0x0);
  }
  else if (type == MODULE_KEYWORD) {
    ref._0_4_ = yang_check_string(module,&module->ref,"reference","module",value,(lys_node *)0x0);
  }
  else if (type == REVISION_KEYWORD) {
    ref._0_4_ = yang_check_string(module,(char **)((long)node + 0x20),"reference",where,value,
                                  (lys_node *)0x0);
  }
  else if (type == NODE_PRINT) {
    ref._0_4_ = yang_check_string(module,(char **)((long)node + 0x10),"reference",where,value,
                                  (lys_node *)node);
  }
  else {
    ref._0_4_ = yang_check_string(module,(char **)((long)node + 0x10),"reference",where,value,
                                  (lys_node *)0x0);
  }
  return (int)ref;
}

Assistant:

int
yang_read_reference(struct lys_module *module, void *node, char *value, char *where, enum yytokentype type)
{
    int ret;
    char *ref = "reference";

    switch (type) {
    case MODULE_KEYWORD:
        ret = yang_check_string(module, &module->ref, ref, "module", value, NULL);
        break;
    case REVISION_KEYWORD:
        ret = yang_check_string(module, &((struct lys_revision *)node)->ref, ref, where, value, NULL);
        break;
    case IMPORT_KEYWORD:
        ret = yang_check_string(module, &((struct lys_import *)node)->ref, ref, where, value, NULL);
        break;
    case INCLUDE_KEYWORD:
        ret = yang_check_string(module, &((struct lys_include *)node)->ref, ref, where, value, NULL);
        break;
    case NODE_PRINT:
        ret = yang_check_string(module, &((struct lys_node *)node)->ref, ref, where, value, node);
        break;
    default:
        ret = yang_check_string(module, &((struct lys_node *)node)->ref, ref, where, value, NULL);
        break;
    }
    return ret;
}